

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsBrokerFree(HelicsBroker broker)

{
  MasterObjectHolder *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) {
    *(undefined4 *)((long)broker + 0x14) = 0;
    getMasterHolder();
    MasterObjectHolder::clearBroker(local_20,*(int *)((long)broker + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  helics::BrokerFactory::cleanUpBrokers();
  return;
}

Assistant:

void helicsBrokerFree(HelicsBroker broker)
{
    auto* brokerObj = helics::getBrokerObject(broker, nullptr);
    if (brokerObj != nullptr) {
        brokerObj->valid = 0;
        getMasterHolder()->clearBroker(brokerObj->index);
    }
    helics::BrokerFactory::cleanUpBrokers();
}